

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstring_agg.cpp
# Opt level: O0

void duckdb::BitStringAggOperation::
     Combine<duckdb::BitAggState<short>,duckdb::BitStringAggOperation>
               (BitAggState<short> *source,BitAggState<short> *target,AggregateInputData *param_3)

{
  string_t input;
  byte *in_RSI;
  byte *in_RDI;
  BitAggState<short> *unaff_retaddr;
  undefined8 in_stack_00000008;
  bitstring_t *in_stack_00000070;
  bitstring_t *in_stack_00000078;
  bitstring_t *in_stack_00000080;
  
  if ((*in_RDI & 1) != 0) {
    if ((*in_RSI & 1) == 0) {
      input.value.pointer.ptr = (char *)param_3;
      input.value._0_8_ = in_stack_00000008;
      Assign<duckdb::string_t,duckdb::BitAggState<short>>(unaff_retaddr,input);
      *in_RSI = 1;
      *(undefined2 *)(in_RSI + 0x18) = *(undefined2 *)(in_RDI + 0x18);
      *(undefined2 *)(in_RSI + 0x1a) = *(undefined2 *)(in_RDI + 0x1a);
    }
    else {
      Bit::BitwiseOr(in_stack_00000080,in_stack_00000078,in_stack_00000070);
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_set) {
			return;
		}
		if (!target.is_set) {
			Assign(target, source.value);
			target.is_set = true;
			target.min = source.min;
			target.max = source.max;
		} else {
			Bit::BitwiseOr(source.value, target.value, target.value);
		}
	}